

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Module.c
# Opt level: O0

cs_err AArch64_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  AArch64_init(in_stack_00000020);
  *(code **)(in_RDI + 8) = AArch64_printInst;
  *(void **)(in_RDI + 0x10) = pvVar1;
  *(void **)(in_RDI + 0x20) = pvVar1;
  *(code **)(in_RDI + 0x18) = AArch64_getInstruction;
  *(code **)(in_RDI + 0x28) = AArch64_reg_name;
  *(code **)(in_RDI + 0x40) = AArch64_get_insn_id;
  *(code **)(in_RDI + 0x30) = AArch64_insn_name;
  *(code **)(in_RDI + 0x38) = AArch64_group_name;
  *(code **)(in_RDI + 0x48) = AArch64_post_printer;
  *(code **)(in_RDI + 0xa8) = AArch64_reg_access;
  return CS_ERR_OK;
}

Assistant:

cs_err AArch64_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	AArch64_init(mri);
	ud->printer = AArch64_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = AArch64_getInstruction;
	ud->reg_name = AArch64_reg_name;
	ud->insn_id = AArch64_get_insn_id;
	ud->insn_name = AArch64_insn_name;
	ud->group_name = AArch64_group_name;
	ud->post_printer = AArch64_post_printer;
#ifndef CAPSTONE_DIET
	ud->reg_access = AArch64_reg_access;
#endif

	return CS_ERR_OK;
}